

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O0

void If_Dec7Verify(word *t,word z)

{
  uint uVar1;
  int local_6c;
  int v;
  int i;
  word r [2];
  word f [4] [2];
  word z_local;
  word *t_local;
  
  f[3][1] = z;
  if (z != 0) {
    for (local_6c = 0; local_6c < 4; local_6c = local_6c + 1) {
      uVar1 = (uint)(f[3][1] >> ((char)(local_6c << 2) + 0x10U & 0x3f)) & 7;
      f[(long)local_6c + -1][1] = Truth7[(int)uVar1][0];
      f[local_6c][0] = Truth7[(int)uVar1][1];
    }
    If_Dec7ComposeLut4((uint)f[3][1] & 0xffff,(word (*) [2])(r + 1),(word *)&v);
    f[2][1] = _v;
    f[3][0] = r[0];
    for (local_6c = 0; local_6c < 3; local_6c = local_6c + 1) {
      uVar1 = (uint)(f[3][1] >> ((char)(local_6c << 2) + 0x30U & 0x3f)) & 7;
      f[(long)local_6c + -1][1] = Truth7[(int)uVar1][0];
      f[local_6c][0] = Truth7[(int)uVar1][1];
    }
    If_Dec7ComposeLut4((uint)(f[3][1] >> 0x20) & 0xffff,(word (*) [2])(r + 1),(word *)&v);
    if ((_v != *t) || (r[0] != t[1])) {
      If_DecPrintConfig(f[3][1]);
      Kit_DsdPrintFromTruth((uint *)t,7);
      printf("\n");
      Kit_DsdPrintFromTruth((uint *)&v,7);
      printf("\n");
      printf("Verification failed!\n");
    }
    return;
  }
  __assert_fail("z",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDec07.c"
                ,0xb2,"void If_Dec7Verify(word *, word)");
}

Assistant:

void If_Dec7Verify( word t[2], word z )
{
    word f[4][2], r[2];
    int i, v;
    assert( z );
    for ( i = 0; i < 4; i++ )
    {
        v = (z >> (16+(i<<2))) & 7;
        f[i][0] = Truth7[v][0];
        f[i][1] = Truth7[v][1];
    }
    If_Dec7ComposeLut4( (int)(z & 0xffff), f, r );
    f[3][0] = r[0];
    f[3][1] = r[1];
    for ( i = 0; i < 3; i++ )
    {
        v = (z >> (48+(i<<2))) & 7;
        f[i][0] = Truth7[v][0];
        f[i][1] = Truth7[v][1];
    }
    If_Dec7ComposeLut4( (int)((z >> 32) & 0xffff), f, r );
    if ( r[0] != t[0] || r[1] != t[1] )
    {
        If_DecPrintConfig( z );
        Kit_DsdPrintFromTruth( (unsigned*)t, 7 ); printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)r, 7 ); printf( "\n" );
        printf( "Verification failed!\n" );
    }
}